

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_estimateCCtxSize_usingCCtxParams_internal
                 (ZSTD_compressionParameters *cParams,ldmParams_t *ldmParams,int isStatic,
                 ZSTD_paramSwitch_e useRowMatchFinder,size_t buffInSize,size_t buffOutSize,
                 U64 pledgedSrcSize,int useSequenceProducer,size_t maxBlockSize)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong maxChunkSize;
  
  uVar7 = 1L << ((byte)cParams->windowLog & 0x3f);
  if (pledgedSrcSize <= uVar7) {
    uVar7 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar7 = 1;
  }
  maxChunkSize = 0x20000;
  if (maxBlockSize != 0) {
    maxChunkSize = maxBlockSize;
  }
  if (uVar7 <= maxChunkSize) {
    maxChunkSize = uVar7;
  }
  uVar7 = ((maxChunkSize >> 10) + maxChunkSize / 3) * 0x10 + 0x5f & 0xffffffffffffffc0;
  if (useSequenceProducer == 0) {
    uVar7 = 0;
  }
  uVar1 = maxChunkSize / (4 - (ulong)(useSequenceProducer != 0 || cParams->minMatch == 3));
  sVar2 = ZSTD_sizeof_matchState(cParams,useRowMatchFinder,0,1);
  sVar3 = ZSTD_ldm_getTableSize(*ldmParams);
  sVar4 = ZSTD_ldm_getMaxNbSeq(*ldmParams,maxChunkSize);
  uVar5 = sVar4 * 0xc + 0x3f & 0xffffffffffffffc0;
  if (ldmParams->enableLdm != ZSTD_ps_enable) {
    uVar5 = 0;
  }
  lVar6 = buffInSize + 0x4ed8;
  if (isStatic != 0) {
    lVar6 = buffInSize + 0x6358;
  }
  return uVar5 + sVar3 +
         lVar6 + buffOutSize + sVar2 + maxChunkSize + uVar1 * 3 +
         (uVar1 * 8 + 0x3f & 0xffffffffffffffc0) + uVar7 + 0x20;
}

Assistant:

static size_t ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        const ZSTD_compressionParameters* cParams,
        const ldmParams_t* ldmParams,
        const int isStatic,
        const ZSTD_paramSwitch_e useRowMatchFinder,
        const size_t buffInSize,
        const size_t buffOutSize,
        const U64 pledgedSrcSize,
        int useSequenceProducer,
        size_t maxBlockSize)
{
    size_t const windowSize = (size_t) BOUNDED(1ULL, 1ULL << cParams->windowLog, pledgedSrcSize);
    size_t const blockSize = MIN(ZSTD_resolveMaxBlockSize(maxBlockSize), windowSize);
    size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, cParams->minMatch, useSequenceProducer);
    size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                            + ZSTD_cwksp_aligned_alloc_size(maxNbSeq * sizeof(seqDef))
                            + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
    size_t const entropySpace = ZSTD_cwksp_alloc_size(ENTROPY_WORKSPACE_SIZE);
    size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
    size_t const matchStateSize = ZSTD_sizeof_matchState(cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 0, /* forCCtx */ 1);

    size_t const ldmSpace = ZSTD_ldm_getTableSize(*ldmParams);
    size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(*ldmParams, blockSize);
    size_t const ldmSeqSpace = ldmParams->enableLdm == ZSTD_ps_enable ?
        ZSTD_cwksp_aligned_alloc_size(maxNbLdmSeq * sizeof(rawSeq)) : 0;


    size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize)
                             + ZSTD_cwksp_alloc_size(buffOutSize);

    size_t const cctxSpace = isStatic ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;

    size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
    size_t const externalSeqSpace = useSequenceProducer
        ? ZSTD_cwksp_aligned_alloc_size(maxNbExternalSeq * sizeof(ZSTD_Sequence))
        : 0;

    size_t const neededSpace =
        cctxSpace +
        entropySpace +
        blockStateSpace +
        ldmSpace +
        ldmSeqSpace +
        matchStateSize +
        tokenSpace +
        bufferSpace +
        externalSeqSpace;

    DEBUGLOG(5, "estimate workspace : %u", (U32)neededSpace);
    return neededSpace;
}